

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilSupp.c
# Opt level: O1

Vec_Wrd_t * Abc_SuppGenPairs(Vec_Wrd_t *p,int nBits)

{
  ulong *puVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  Vec_Wrd_t *p_00;
  word *pwVar5;
  void *__ptr;
  long lVar6;
  char cVar7;
  uint uVar8;
  ulong *puVar9;
  ulong *puVar10;
  ulong *puVar11;
  
  p_00 = (Vec_Wrd_t *)malloc(0x10);
  p_00->nCap = 1000;
  p_00->nSize = 0;
  pwVar5 = (word *)malloc(8000);
  cVar7 = '\x05';
  if (5 < nBits) {
    cVar7 = (char)nBits;
  }
  p_00->pArray = pwVar5;
  __ptr = calloc((long)(1 << (cVar7 - 5U & 0x1f)),4);
  if (0 < (long)p->nSize) {
    puVar1 = p->pArray + p->nSize;
    puVar10 = p->pArray;
    do {
      puVar11 = puVar10 + 1;
      for (puVar9 = puVar11; puVar9 < puVar1; puVar9 = puVar9 + 1) {
        uVar3 = *puVar9;
        uVar4 = *puVar10;
        uVar8 = (uint)(uVar3 ^ uVar4);
        lVar6 = (long)((int)uVar8 >> 5);
        uVar2 = *(uint *)((long)__ptr + lVar6 * 4);
        uVar8 = uVar8 & 0x1f;
        if ((uVar2 >> uVar8 & 1) == 0) {
          *(uint *)((long)__ptr + lVar6 * 4) = uVar2 ^ 1 << uVar8;
          Vec_WrdPush(p_00,uVar3 ^ uVar4);
        }
      }
      puVar10 = puVar11;
    } while (puVar11 < puVar1);
  }
  if (__ptr != (void *)0x0) {
    free(__ptr);
  }
  return p_00;
}

Assistant:

Vec_Wrd_t * Abc_SuppGenPairs( Vec_Wrd_t * p, int nBits )
{
    Vec_Wrd_t * vRes = Vec_WrdAlloc( 1000 );
    unsigned * pMap = ABC_CALLOC( unsigned, 1 << Abc_MaxInt(0,nBits-5) ); 
    word * pLimit = Vec_WrdLimit(p);
    word * pEntry1 = Vec_WrdArray(p);
    word * pEntry2, Value;
    for ( ; pEntry1 < pLimit; pEntry1++ )
    for ( pEntry2 = pEntry1 + 1; pEntry2 < pLimit; pEntry2++ )
    {
        Value = *pEntry1 ^ *pEntry2;
        if ( Abc_InfoHasBit(pMap, (int)Value) )
            continue;
        Abc_InfoXorBit( pMap, (int)Value );
        Vec_WrdPush( vRes, Value );
    }
    ABC_FREE( pMap );
    return vRes;
}